

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dispatch.cpp
# Opt level: O2

void __thiscall ac::core::cpu::dispatch::detail::ISA::ISA(ISA *this)

{
  int iVar1;
  
  ruapu_init();
  iVar1 = ruapu_supports("sse3");
  this->sse = SUB41(iVar1,0);
  iVar1 = ruapu_supports("avx");
  this->avx = SUB41(iVar1,0);
  iVar1 = ruapu_supports("fma");
  this->fma = SUB41(iVar1,0);
  iVar1 = ruapu_supports("neon");
  this->neon = SUB41(iVar1,0);
  return;
}

Assistant:

ISA() noexcept
        {
            ruapu_init();
            sse = ruapu_supports("sse3");
            avx = ruapu_supports("avx");
            fma = ruapu_supports("fma");
            neon = ruapu_supports("neon");
        }